

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::SampleQualifierRenderCase::
getIterationDescription_abi_cxx11_(string *__return_storage_ptr__,void *this,int iteration)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(iteration) {
  case 0:
    pcVar2 = "Test with float varying";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "Test with vec2 varying";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "Test with vec3 varying";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "Test with vec4 varying";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "Test with array varying";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "Test with struct varying";
    pcVar1 = "";
    break;
  default:
    pcVar1 = "";
    pcVar2 = pcVar1;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string	SampleQualifierRenderCase::getIterationDescription (int iteration) const
{
	if (iteration == 0)
		return "Test with float varying";
	else if (iteration == 1)
		return "Test with vec2 varying";
	else if (iteration == 2)
		return "Test with vec3 varying";
	else if (iteration == 3)
		return "Test with vec4 varying";
	else if (iteration == 4)
		return "Test with array varying";
	else if (iteration == 5)
		return "Test with struct varying";

	DE_ASSERT(false);
	return "";
}